

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

string * __thiscall Expression::describe_abi_cxx11_(string *__return_storage_ptr__,Expression *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (**(this->P1->super_AST)._vptr_AST)(&local_38);
  std::operator+(&local_98,&local_38," ");
  (**(this->O->super_Terminal).super_AST._vptr_AST)(&local_b8);
  std::operator+(&local_78,&local_98,&local_b8);
  std::operator+(&local_58,&local_78," ");
  (**(this->P2->super_AST)._vptr_AST)(&bStack_d8);
  std::operator+(__return_storage_ptr__,&local_58,&bStack_d8);
  std::__cxx11::string::~string((string *)&bStack_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Expression::describe() {
    return P1->describe() + " " + O->describe() + " " + P2->describe();
}